

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

_Bool arena_decay_ms_set(tsdn_t *tsdn,arena_t *arena,arena_decay_t *decay,extents_t *extents,
                        ssize_t decay_ms)

{
  _Bool _Var1;
  malloc_mutex_t *in_RCX;
  tsdn_t *in_RDX;
  tsdn_t *in_RSI;
  arena_decay_t *in_R8;
  _Bool in_stack_0000003f;
  extents_t *in_stack_00000040;
  arena_decay_t *in_stack_00000048;
  arena_t *in_stack_00000050;
  tsdn_t *in_stack_00000058;
  ssize_t in_stack_ffffffffffffffc8;
  undefined1 local_1;
  
  _Var1 = arena_decay_ms_valid((ssize_t)in_R8);
  if (_Var1) {
    malloc_mutex_lock(in_RSI,(malloc_mutex_t *)in_RDX);
    arena_decay_reinit(in_R8,in_stack_ffffffffffffffc8);
    arena_maybe_decay(in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040,
                      in_stack_0000003f);
    malloc_mutex_unlock(in_RDX,in_RCX);
  }
  local_1 = !_Var1;
  return local_1;
}

Assistant:

static bool
arena_decay_ms_set(tsdn_t *tsdn, arena_t *arena, arena_decay_t *decay,
    extents_t *extents, ssize_t decay_ms) {
	if (!arena_decay_ms_valid(decay_ms)) {
		return true;
	}

	malloc_mutex_lock(tsdn, &decay->mtx);
	/*
	 * Restart decay backlog from scratch, which may cause many dirty pages
	 * to be immediately purged.  It would conceptually be possible to map
	 * the old backlog onto the new backlog, but there is no justification
	 * for such complexity since decay_ms changes are intended to be
	 * infrequent, either between the {-1, 0, >0} states, or a one-time
	 * arbitrary change during initial arena configuration.
	 */
	arena_decay_reinit(decay, decay_ms);
	arena_maybe_decay(tsdn, arena, decay, extents, false);
	malloc_mutex_unlock(tsdn, &decay->mtx);

	return false;
}